

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O2

void __thiscall neueda::cdr::deleteItem(cdr *this,cdrKey_t *key)

{
  itemMap *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  
  this_00 = &this->mItems;
  sVar1 = std::
          map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
          ::count(this_00,key);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
             ::operator[](this_00,key);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_neueda::cdrItem_*>,_std::_Select1st<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
    ::erase(&(this->mOrdered)._M_t,&pmVar2->mIndex);
    std::
    _Rb_tree<int,_std::pair<const_int,_neueda::cdrItem>,_std::_Select1st<std::pair<const_int,_neueda::cdrItem>_>,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::erase(&this_00->_M_t,key);
    return;
  }
  return;
}

Assistant:

void
cdr::deleteItem (const cdrKey_t& key)
{
    if (mItems.count (key) != 0)
    {
        mOrdered.erase (mItems[key].mIndex);
        mItems.erase (key);
    }
}